

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::DualizeBackBasicSolution
          (Model *this,Vector *x_solver,Vector *y_solver,Vector *z_solver,Vector *x_user,
          Vector *slack_user,Vector *y_user,Vector *z_user)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  double *pdVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  _Expr<std::__detail::_UnClos<std::__negate,_std::_ValArray,_double>,_double> local_38;
  
  iVar1 = this->num_cols_;
  if (this->dualized_ == true) {
    local_38._M_closure.super__UnBase<std::__negate,_std::valarray<double>_>._M_expr =
         (_UnClos<std::__negate,_std::_ValArray,_double>)
         (_UnClos<std::__negate,_std::_ValArray,_double>)y_solver;
    std::valarray<double>::operator=(x_user,&local_38);
    uVar2 = this->num_constr_;
    pdVar8 = z_solver->_M_data;
    pdVar4 = slack_user->_M_data;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pdVar4[uVar6] = -pdVar8[uVar6];
    }
    if (0 < (int)uVar2) {
      pdVar8 = (double *)y_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = y_user->_M_data;
      }
      pdVar4 = (double *)x_solver->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = x_solver->_M_data;
      }
      memmove(pdVar8,pdVar4,(ulong)uVar2 << 3);
    }
    if (0 < (long)this->num_var_) {
      pdVar8 = (double *)z_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = z_user->_M_data;
      }
      pdVar4 = (double *)x_solver->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = x_solver->_M_data;
      }
      memmove(pdVar8,pdVar4 + iVar1,(long)this->num_var_ << 3);
    }
    piVar3 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar8 = z_user->_M_data;
    pdVar4 = x_solver->_M_data + this->num_constr_;
    for (piVar5 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar5 != piVar3; piVar5 = piVar5 + 1) {
      pdVar8[*piVar5] = pdVar8[*piVar5] - *pdVar4;
      pdVar4 = pdVar4 + 1;
    }
  }
  else {
    if (0 < (long)this->num_var_) {
      pdVar8 = (double *)x_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = x_user->_M_data;
      }
      pdVar4 = (double *)x_solver->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = x_solver->_M_data;
      }
      memmove(pdVar8,pdVar4,(long)this->num_var_ << 3);
    }
    if (0 < (long)this->num_constr_) {
      pdVar8 = (double *)slack_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = slack_user->_M_data;
      }
      pdVar4 = (double *)x_solver->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = x_solver->_M_data;
      }
      memmove(pdVar8,pdVar4 + iVar1,(long)this->num_constr_ << 3);
      if (0 < (long)this->num_constr_) {
        pdVar8 = (double *)y_user->_M_size;
        if (pdVar8 != (double *)0x0) {
          pdVar8 = y_user->_M_data;
        }
        pdVar4 = (double *)y_solver->_M_size;
        if (pdVar4 != (double *)0x0) {
          pdVar4 = y_solver->_M_data;
        }
        memmove(pdVar8,pdVar4,(long)this->num_constr_ << 3);
      }
    }
    if (0 < (long)this->num_var_) {
      pdVar8 = (double *)z_user->_M_size;
      if (pdVar8 != (double *)0x0) {
        pdVar8 = z_user->_M_data;
      }
      pdVar4 = (double *)z_solver->_M_size;
      if (pdVar4 != (double *)0x0) {
        pdVar4 = z_solver->_M_data;
      }
      memmove(pdVar8,pdVar4,(long)this->num_var_ << 3);
      return;
    }
  }
  return;
}

Assistant:

void Model::DualizeBackBasicSolution(const Vector& x_solver,
                                     const Vector& y_solver,
                                     const Vector& z_solver,
                                     Vector& x_user,
                                     Vector& slack_user,
                                     Vector& y_user,
                                     Vector& z_user) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + (Int)boxed_vars_.size() == n);
        x_user = -y_solver;
        for (Int i = 0; i < num_constr_; i++)
            slack_user[i] = -z_solver[i];
        std::copy_n(std::begin(x_solver), num_constr_, std::begin(y_user));
        std::copy_n(std::begin(x_solver) + n, num_var_, std::begin(z_user));
        Int k = num_constr_;
        for (Int j : boxed_vars_)
            z_user[j] -= x_solver[k++];
        assert(k == n);
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_solver), num_var_, std::begin(x_user));
        std::copy_n(std::begin(x_solver) + n, num_constr_,
                    std::begin(slack_user));
        std::copy_n(std::begin(y_solver), num_constr_, std::begin(y_user));
        std::copy_n(std::begin(z_solver), num_var_, std::begin(z_user));
    }
}